

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,xmlSchemaPSVIIDCNodePtr item)

{
  int iVar1;
  xmlSchemaPSVIIDCNodePtr *ppxVar2;
  xmlSchemaPSVIIDCNodePtr item_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt->idcNodes == (xmlSchemaPSVIIDCNodePtr *)0x0) {
    ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)(0xa0);
    vctxt->idcNodes = ppxVar2;
    if (vctxt->idcNodes == (xmlSchemaPSVIIDCNodePtr *)0x0) {
      xmlSchemaVErrMemory(vctxt,"allocating the IDC node table item list",(xmlNodePtr)0x0);
      return -1;
    }
    vctxt->sizeIdcNodes = 0x14;
  }
  else if (vctxt->sizeIdcNodes <= vctxt->nbIdcNodes) {
    vctxt->sizeIdcNodes = vctxt->sizeIdcNodes << 1;
    ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)
              (*xmlRealloc)(vctxt->idcNodes,(long)vctxt->sizeIdcNodes << 3);
    vctxt->idcNodes = ppxVar2;
    if (vctxt->idcNodes == (xmlSchemaPSVIIDCNodePtr *)0x0) {
      xmlSchemaVErrMemory(vctxt,"re-allocating the IDC node table item list",(xmlNodePtr)0x0);
      return -1;
    }
  }
  iVar1 = vctxt->nbIdcNodes;
  vctxt->nbIdcNodes = iVar1 + 1;
  vctxt->idcNodes[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,
			       xmlSchemaPSVIIDCNodePtr item)
{
    /*
    * Add to global list.
    */
    if (vctxt->idcNodes == NULL) {
	vctxt->idcNodes = (xmlSchemaPSVIIDCNodePtr *)
	    xmlMalloc(20 * sizeof(xmlSchemaPSVIIDCNodePtr));
	if (vctxt->idcNodes == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"allocating the IDC node table item list", NULL);
	    return (-1);
	}
	vctxt->sizeIdcNodes = 20;
    } else if (vctxt->sizeIdcNodes <= vctxt->nbIdcNodes) {
	vctxt->sizeIdcNodes *= 2;
	vctxt->idcNodes = (xmlSchemaPSVIIDCNodePtr *)
	    xmlRealloc(vctxt->idcNodes, vctxt->sizeIdcNodes *
	    sizeof(xmlSchemaPSVIIDCNodePtr));
	if (vctxt->idcNodes == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"re-allocating the IDC node table item list", NULL);
	    return (-1);
	}
    }
    vctxt->idcNodes[vctxt->nbIdcNodes++] = item;

    return (0);
}